

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O1

optional<Token> * __thiscall
Tokenizer::nextToken(optional<Token> *__return_storage_ptr__,Tokenizer *this)

{
  unsigned_long uVar1;
  ushort uVar2;
  char *pcVar3;
  bool bVar4;
  optional<char> oVar5;
  int iVar6;
  uint32_t uVar7;
  uint uVar8;
  iterator iVar9;
  int *piVar10;
  ulong uVar11;
  string *psVar12;
  uint uVar13;
  _Storage *p_Var14;
  uint uVar15;
  _Storage<char,_true> _Var16;
  bool bVar17;
  pair<unsigned_long,_unsigned_long> pVar18;
  out_of_range anon_var_0;
  stringstream ss;
  undefined1 local_5b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5a8;
  any *local_598;
  _Storage *local_590;
  any local_588;
  uint64_t uStack_578;
  _Arg local_570;
  code *local_568;
  _Storage local_560;
  code *local_558;
  _Storage local_550;
  code *local_548;
  _Storage local_540;
  code *local_538;
  _Storage local_530;
  any local_528;
  any local_518;
  any local_508;
  any local_4f8;
  code *local_4e8;
  undefined8 local_4e0;
  code *local_4d8;
  undefined8 local_4d0;
  code *local_4c8;
  undefined8 local_4c0;
  code *local_4b8;
  undefined8 local_4b0;
  code *local_4a8;
  undefined8 local_4a0;
  code *local_498;
  undefined8 local_490;
  code *local_488;
  undefined8 local_480;
  code *local_478;
  undefined8 local_470;
  code *local_468;
  undefined8 local_460;
  code *local_458;
  undefined8 local_450;
  code *local_448;
  undefined8 local_440;
  code *local_438;
  undefined8 local_430;
  code *local_428;
  undefined8 local_420;
  code *local_418;
  ulong local_410;
  code *local_408;
  ulong local_400;
  code *local_3f8;
  ulong local_3f0;
  code *local_3e8;
  ulong local_3e0;
  string local_3d8;
  string local_3b8 [7];
  undefined1 *local_2d8;
  long local_2d0;
  undefined1 local_2c8 [80];
  undefined1 *local_278;
  long local_270;
  undefined1 local_268 [16];
  long *local_258;
  ulong local_250;
  long local_248 [2];
  long *local_238;
  ulong local_230;
  long local_228 [2];
  undefined7 *local_218;
  undefined8 local_210;
  undefined7 local_208;
  undefined1 uStack_201;
  undefined7 uStack_200;
  undefined1 local_1f9;
  undefined7 *local_1f8;
  undefined8 local_1f0;
  undefined7 local_1e8;
  undefined1 uStack_1e1;
  undefined7 uStack_1e0;
  undefined1 local_1d9;
  undefined7 *local_1d8;
  undefined8 local_1d0;
  undefined7 local_1c8;
  undefined1 uStack_1c1;
  undefined7 uStack_1c0;
  undefined1 local_1b9;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_598 = &(__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
               super__Optional_payload<Token,_true,_false,_false>.
               super__Optional_payload_base<Token>._M_payload._M_value._value;
  uVar15 = 0;
  do {
    p_Var14 = &local_588._M_storage;
    oVar5 = nextChar(this);
    if (0x11 < uVar15) {
LAB_0010ed23:
      bVar17 = true;
      goto LAB_0010eca6;
    }
    uVar8 = (uint)(ushort)oVar5.super__Optional_base<char,_true,_true>._M_payload.
                          super__Optional_payload_base<char>;
    uVar2 = (ushort)oVar5.super__Optional_base<char,_true,_true>._M_payload.
                    super__Optional_payload_base<char> >> 8;
    _Var16._M_value =
         oVar5.super__Optional_base<char,_true,_true>._M_payload.super__Optional_payload_base<char>.
         _M_payload;
    switch(uVar15) {
    case 0:
      if ((uVar2 & 1) != 0) {
        uVar13 = uVar8 & 0xff;
        iVar6 = isspace(uVar13);
        uVar15 = 0;
        if (iVar6 == 0) {
          iVar6 = isprint(uVar13);
          bVar17 = true;
          if (iVar6 == 0) {
LAB_0010ecf6:
            uVar15 = 0;
            bVar4 = true;
          }
          else {
            if (uVar13 - 0x30 < 10) {
              uVar15 = 1;
            }
            else {
              iVar6 = isalpha(uVar13);
              if (iVar6 == 0) {
                uVar8 = uVar8 & 0xff;
                switch(uVar8) {
                case 0x21:
                  uVar15 = 0xf;
                  break;
                case 0x22:
                case 0x23:
                case 0x24:
                case 0x25:
                case 0x26:
                case 0x27:
                case 0x2e:
                case 0x30:
                case 0x31:
                case 0x32:
                case 0x33:
                case 0x34:
                case 0x35:
                case 0x36:
                case 0x37:
                case 0x38:
                case 0x39:
                case 0x3a:
switchD_0010eccd_caseD_22:
                  goto LAB_0010ecf6;
                case 0x28:
                  uVar15 = 9;
                  break;
                case 0x29:
                  uVar15 = 10;
                  break;
                case 0x2a:
                  uVar15 = 5;
                  break;
                case 0x2b:
                  uVar15 = 2;
                  break;
                case 0x2c:
                  uVar15 = 0x10;
                  break;
                case 0x2d:
                  uVar15 = 3;
                  break;
                case 0x2f:
                  uVar15 = 4;
                  break;
                case 0x3b:
                  uVar15 = 8;
                  break;
                case 0x3c:
                  uVar15 = 0xc;
                  break;
                case 0x3d:
                  uVar15 = 7;
                  break;
                case 0x3e:
                  uVar15 = 0xb;
                  break;
                default:
                  if (uVar8 == 0x7b) {
                    uVar15 = 0xd;
                  }
                  else {
                    if (uVar8 != 0x7d) goto switchD_0010eccd_caseD_22;
                    uVar15 = 0xe;
                  }
                }
              }
              else {
                uVar15 = 6;
              }
            }
            bVar17 = false;
            bVar4 = false;
          }
        }
        else {
          bVar4 = true;
          bVar17 = false;
        }
        if (bVar17) {
          pVar18 = previousPos(this);
          this->_ptr = pVar18;
          psVar12 = (string *)__cxa_allocate_exception(0x28);
          local_1d8 = &local_1c8;
          local_1c8 = 0x64696c61766e49;
          uStack_1c1 = 0x49;
          uStack_1c0 = 0x7272457475706e;
          local_1d0 = 0xf;
          local_1b9 = 0;
          uVar1 = (this->_ptr).first;
          *(string **)psVar12 = psVar12 + 0x10;
          std::__cxx11::string::_M_construct<char*>(psVar12,local_1d8,&local_1b9);
          *(unsigned_long *)(psVar12 + 0x20) = uVar1 + 1;
          __cxa_throw(psVar12,&Error::typeinfo,Error::~Error);
        }
        if (!bVar4) {
          local_5b8[0] = _Var16._M_value;
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_5b8,1);
        }
        goto LAB_0010ed23;
      }
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_engaged = false;
      bVar17 = false;
      uVar15 = 0;
      goto LAB_0010eca6;
    case 1:
      if ((uVar2 & 1) == 0) {
        std::__cxx11::stringbuf::str();
        if (*(char *)CONCAT44(local_5b8._4_4_,local_5b8._0_4_) == '0') {
          std::__cxx11::stringbuf::str();
          bVar17 = 1 < local_230;
          if (local_238 != local_228) {
            operator_delete(local_238,local_228[0] + 1);
          }
        }
        else {
          bVar17 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_5b8._4_4_,local_5b8._0_4_) != &local_5a8) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_5b8._4_4_,local_5b8._0_4_),
                          local_5a8._M_allocated_capacity + 1);
        }
        if (bVar17) goto LAB_0010ee98;
        std::__cxx11::stringbuf::str();
        pcVar3 = (char *)CONCAT44(local_5b8._4_4_,local_5b8._0_4_);
        piVar10 = __errno_location();
        iVar6 = *piVar10;
        *piVar10 = 0;
        uVar11 = strtol(pcVar3,(char **)&local_590,10);
        if (local_590 != (_Storage *)pcVar3) {
          if (((long)(int)uVar11 == uVar11) && (*piVar10 != 0x22)) {
            if (*piVar10 == 0) {
              *piVar10 = iVar6;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_5b8._4_4_,local_5b8._0_4_) != &local_5a8) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT44(local_5b8._4_4_,local_5b8._0_4_),
                              local_5a8._M_allocated_capacity + 1);
            }
            local_3e8 = std::any::_Manager_internal<int>::_S_manage;
            local_3e0 = uVar11 & 0xffffffff;
            local_5a8._8_8_ = (this->_ptr).first + 1;
            local_5b8._0_4_ = UNSIGNED_INTEGER;
            local_5a8._M_allocated_capacity = uVar11 & 0xffffffff;
            local_5b8._8_8_ = std::any::_Manager_internal<int>::_S_manage;
            (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
            super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
            _M_payload._M_value._type = UNSIGNED_INTEGER;
            std::any::any(local_598,(any *)(local_5b8 + 8));
            (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
            super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
            _M_payload._M_value._lineNumber = local_5a8._8_8_;
            (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
            super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
            _M_engaged = true;
            if ((code *)local_5b8._8_8_ != (code *)0x0) {
              (*(code *)local_5b8._8_8_)(_Op_destroy,(any *)(local_5b8 + 8),(_Arg *)0x0);
              local_5b8._8_8_ = (code *)0x0;
            }
            if (local_3e8 != (code *)0x0) {
              (*local_3e8)(3,&local_3e8,0);
              local_3e8 = (code *)0x0;
            }
            uVar15 = 1;
            break;
          }
          std::__throw_out_of_range("stoi");
        }
        std::__throw_invalid_argument("stoi");
LAB_0010ee98:
        psVar12 = (string *)__cxa_allocate_exception(0x28);
        local_278 = local_268;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"StartWithZeroErr","");
        uVar1 = (this->_ptr).first;
        *(string **)psVar12 = psVar12 + 0x10;
        std::__cxx11::string::_M_construct<char*>(psVar12,local_278,local_278 + local_270);
        *(unsigned_long *)(psVar12 + 0x20) = uVar1 + 1;
        __cxa_throw(psVar12,&Error::typeinfo,Error::~Error);
      }
      if ((uVar8 & 0xff) - 0x30 < 10) {
        local_5b8[0] = _Var16._M_value;
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_5b8,1);
        uVar15 = 1;
LAB_0010e41b:
        bVar17 = true;
      }
      else {
        iVar6 = isalpha(uVar8 & 0xff);
        if (iVar6 != 0) {
          local_5b8[0] = _Var16._M_value;
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_5b8,1);
          std::__cxx11::stringbuf::str();
          if ((code *)local_5b8._8_8_ != (code *)0x2) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_5b8._4_4_,local_5b8._0_4_) != &local_5a8) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT44(local_5b8._4_4_,local_5b8._0_4_),
                              local_5a8._M_allocated_capacity + 1);
            }
LAB_0010efcf:
            psVar12 = (string *)__cxa_allocate_exception(0x28);
            local_1f8 = &local_1e8;
            local_1e8 = 0x64696c61766e49;
            uStack_1e1 = 0x49;
            uStack_1e0 = 0x7272457475706e;
            local_1f0 = 0xf;
            local_1d9 = 0;
            uVar1 = (this->_ptr).first;
            *(string **)psVar12 = psVar12 + 0x10;
            std::__cxx11::string::_M_construct<char*>(psVar12,local_1f8,&local_1d9);
            *(unsigned_long *)(psVar12 + 0x20) = uVar1 + 1;
            __cxa_throw(psVar12,&Error::typeinfo,Error::~Error);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_5b8._4_4_,local_5b8._0_4_) != &local_5a8) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_5b8._4_4_,local_5b8._0_4_),
                            local_5a8._M_allocated_capacity + 1);
          }
          if ((_Var16._M_value & 0xdfU) != 0x58) goto LAB_0010efcf;
          uVar15 = 0x11;
          goto LAB_0010e41b;
        }
        pVar18 = previousPos(this);
        this->_ptr = pVar18;
        std::__cxx11::stringbuf::str();
        if (*(char *)CONCAT44(local_5b8._4_4_,local_5b8._0_4_) == '0') {
          std::__cxx11::stringbuf::str();
          bVar17 = 1 < local_250;
          if (local_258 != local_248) {
            operator_delete(local_258,local_248[0] + 1);
          }
        }
        else {
          bVar17 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_5b8._4_4_,local_5b8._0_4_) != &local_5a8) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_5b8._4_4_,local_5b8._0_4_),
                          local_5a8._M_allocated_capacity + 1);
        }
        if (bVar17) goto LAB_0010f06f;
        std::__cxx11::stringbuf::str();
        pcVar3 = (char *)CONCAT44(local_5b8._4_4_,local_5b8._0_4_);
        piVar10 = __errno_location();
        iVar6 = *piVar10;
        *piVar10 = 0;
        uVar11 = strtol(pcVar3,(char **)&local_590,10);
        if (local_590 == (_Storage *)pcVar3) {
LAB_0010f063:
          std::__throw_invalid_argument("stoi");
LAB_0010f06f:
          psVar12 = (string *)__cxa_allocate_exception(0x28);
          local_2d8 = local_2c8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2d8,"StartWithZeroErr","");
          uVar1 = (this->_ptr).first;
          *(string **)psVar12 = psVar12 + 0x10;
          std::__cxx11::string::_M_construct<char*>(psVar12,local_2d8,local_2d8 + local_2d0);
          *(unsigned_long *)(psVar12 + 0x20) = uVar1 + 1;
          __cxa_throw(psVar12,&Error::typeinfo,Error::~Error);
        }
        if (((long)(int)uVar11 != uVar11) || (*piVar10 == 0x22)) {
          std::__throw_out_of_range("stoi");
          goto LAB_0010f063;
        }
        if (*piVar10 == 0) {
          *piVar10 = iVar6;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_5b8._4_4_,local_5b8._0_4_) != &local_5a8) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_5b8._4_4_,local_5b8._0_4_),
                          local_5a8._M_allocated_capacity + 1);
        }
        local_3f8 = std::any::_Manager_internal<int>::_S_manage;
        local_3f0 = uVar11 & 0xffffffff;
        local_5a8._8_8_ = (this->_ptr).first + 1;
        local_5b8._0_4_ = UNSIGNED_INTEGER;
        local_5a8._M_allocated_capacity = uVar11 & 0xffffffff;
        local_5b8._8_8_ = std::any::_Manager_internal<int>::_S_manage;
        (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_payload._M_value._type = UNSIGNED_INTEGER;
        std::any::any(local_598,(any *)(local_5b8 + 8));
        (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_payload._M_value._lineNumber = local_5a8._8_8_;
        (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_engaged = true;
        if ((code *)local_5b8._8_8_ != (code *)0x0) {
          (*(code *)local_5b8._8_8_)(_Op_destroy,(any *)(local_5b8 + 8),(_Arg *)0x0);
          local_5b8._8_8_ = (code *)0x0;
        }
        if (local_3f8 != (code *)0x0) {
          (*local_3f8)(3,&local_3f8,0);
          local_3f8 = (code *)0x0;
        }
        uVar15 = 1;
        bVar17 = false;
      }
      if (bVar17) goto LAB_0010ed23;
      break;
    case 2:
      pVar18 = previousPos(this);
      this->_ptr = pVar18;
      local_428 = std::any::_Manager_internal<char>::_S_manage;
      local_420 = 0x2b;
      local_5a8._8_8_ = pVar18.first + 1;
      local_5b8._0_4_ = PLUS_SIGN;
      local_5a8._M_allocated_capacity = 0x2b;
      local_5b8._8_8_ = std::any::_Manager_internal<char>::_S_manage;
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_payload._M_value._type = PLUS_SIGN;
      std::any::any(local_598,(any *)(local_5b8 + 8));
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_payload._M_value._lineNumber = local_5a8._8_8_;
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_engaged = true;
      if ((code *)local_5b8._8_8_ != (code *)0x0) {
        (*(code *)local_5b8._8_8_)(_Op_destroy,(any *)(local_5b8 + 8),(_Arg *)0x0);
        local_5b8._8_8_ = (code *)0x0;
      }
      if (local_428 != (code *)0x0) {
        (*local_428)(3,&local_428,0);
        local_428 = (code *)0x0;
      }
      uVar15 = 2;
      break;
    case 3:
      pVar18 = previousPos(this);
      this->_ptr = pVar18;
      local_438 = std::any::_Manager_internal<char>::_S_manage;
      local_430 = 0x2d;
      local_5a8._8_8_ = pVar18.first + 1;
      local_5b8._0_4_ = MINUS_SIGN;
      local_5a8._M_allocated_capacity = 0x2d;
      local_5b8._8_8_ = std::any::_Manager_internal<char>::_S_manage;
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_payload._M_value._type = MINUS_SIGN;
      std::any::any(local_598,(any *)(local_5b8 + 8));
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_payload._M_value._lineNumber = local_5a8._8_8_;
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_engaged = true;
      if ((code *)local_5b8._8_8_ != (code *)0x0) {
        (*(code *)local_5b8._8_8_)(_Op_destroy,(any *)(local_5b8 + 8),(_Arg *)0x0);
        local_5b8._8_8_ = (code *)0x0;
      }
      if (local_438 != (code *)0x0) {
        (*local_438)(3,&local_438,0);
        local_438 = (code *)0x0;
      }
      uVar15 = 3;
      break;
    case 4:
      pVar18 = previousPos(this);
      this->_ptr = pVar18;
      local_458 = std::any::_Manager_internal<char>::_S_manage;
      local_450 = 0x2f;
      local_5a8._8_8_ = pVar18.first + 1;
      local_5b8._0_4_ = DIVISION_SIGN;
      local_5a8._M_allocated_capacity = 0x2f;
      local_5b8._8_8_ = std::any::_Manager_internal<char>::_S_manage;
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_payload._M_value._type = DIVISION_SIGN;
      std::any::any(local_598,(any *)(local_5b8 + 8));
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_payload._M_value._lineNumber = local_5a8._8_8_;
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_engaged = true;
      if ((code *)local_5b8._8_8_ != (code *)0x0) {
        (*(code *)local_5b8._8_8_)(_Op_destroy,(any *)(local_5b8 + 8),(_Arg *)0x0);
        local_5b8._8_8_ = (code *)0x0;
      }
      if (local_458 != (code *)0x0) {
        (*local_458)(3,&local_458,0);
        local_458 = (code *)0x0;
      }
      uVar15 = 4;
      break;
    case 5:
      pVar18 = previousPos(this);
      this->_ptr = pVar18;
      local_448 = std::any::_Manager_internal<char>::_S_manage;
      local_440 = 0x2a;
      local_5a8._8_8_ = pVar18.first + 1;
      local_5b8._0_4_ = MULTIPLICATION_SIGN;
      local_5a8._M_allocated_capacity = 0x2a;
      local_5b8._8_8_ = std::any::_Manager_internal<char>::_S_manage;
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_payload._M_value._type = MULTIPLICATION_SIGN;
      std::any::any(local_598,(any *)(local_5b8 + 8));
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_payload._M_value._lineNumber = local_5a8._8_8_;
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_engaged = true;
      if ((code *)local_5b8._8_8_ != (code *)0x0) {
        (*(code *)local_5b8._8_8_)(_Op_destroy,(any *)(local_5b8 + 8),(_Arg *)0x0);
        local_5b8._8_8_ = (code *)0x0;
      }
      if (local_448 != (code *)0x0) {
        (*local_448)(3,&local_448,0);
        local_448 = (code *)0x0;
      }
      uVar15 = 5;
      break;
    case 6:
      if ((uVar2 & 1) == 0) {
        std::__cxx11::stringbuf::str();
        iVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&ReservedWords_abi_cxx11_._M_t,(key_type *)local_5b8);
        if ((_Rb_tree_header *)iVar9._M_node ==
            &ReservedWords_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
          local_548 = std::any::
                      _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::_S_manage;
          local_540._M_ptr = (void *)0x0;
          std::any::_Manager_external<std::__cxx11::string>::_S_create<std::__cxx11::string&>
                    (&local_540,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5b8)
          ;
          uVar1 = (this->_ptr).first;
          local_590 = (_Storage *)CONCAT44(local_590._4_4_,2);
          local_588._M_storage._M_ptr = (void *)0x0;
          if (local_548 == (code *)0x0) {
            local_588._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
          }
          else {
            local_570._M_obj = &local_588;
            (*local_548)(2,&local_548,&local_570);
          }
          uStack_578 = uVar1 + 1;
          (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
          super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
          _M_payload._M_value._type = (TokenType)local_590;
          std::any::any(local_598,&local_588);
          (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
          super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
          _M_payload._M_value._lineNumber = uStack_578;
          (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
          super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
          _M_engaged = true;
          if (local_588._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
            (*local_588._M_manager)(_Op_destroy,&local_588,(_Arg *)0x0);
            local_588._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
          }
          if (local_548 != (code *)0x0) {
            (*local_548)(3,&local_548,0);
            local_548 = (code *)0x0;
          }
        }
        else {
          local_538 = std::any::
                      _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::_S_manage;
          local_530._M_ptr = (void *)0x0;
          std::any::_Manager_external<std::__cxx11::string>::_S_create<std::__cxx11::string&>
                    (&local_530,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5b8)
          ;
          uVar1 = (this->_ptr).first;
          local_590 = (_Storage *)CONCAT44(local_590._4_4_,3);
          local_588._M_storage._M_ptr = (void *)0x0;
          if (local_538 == (code *)0x0) {
            local_588._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
          }
          else {
            local_570._M_obj = &local_588;
            (*local_538)(2,&local_538,&local_570);
          }
          uStack_578 = uVar1 + 1;
          (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
          super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
          _M_payload._M_value._type = (TokenType)local_590;
          std::any::any(local_598,&local_588);
          (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
          super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
          _M_payload._M_value._lineNumber = uStack_578;
          (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
          super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
          _M_engaged = true;
          if (local_588._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
            (*local_588._M_manager)(_Op_destroy,&local_588,(_Arg *)0x0);
            local_588._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
          }
          if (local_538 != (code *)0x0) {
            (*local_538)(3,&local_538,0);
            local_538 = (code *)0x0;
          }
        }
      }
      else {
        iVar6 = isalpha(uVar8 & 0xff);
        if ((uVar8 & 0xff) - 0x30 < 10 || iVar6 != 0) {
          local_5b8[0] = _Var16._M_value;
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_5b8,1);
          uVar15 = 6;
          goto LAB_0010ed23;
        }
        pVar18 = previousPos(this);
        this->_ptr = pVar18;
        std::__cxx11::stringbuf::str();
        iVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&ReservedWords_abi_cxx11_._M_t,(key_type *)local_5b8);
        if ((_Rb_tree_header *)iVar9._M_node ==
            &ReservedWords_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
          local_568 = std::any::
                      _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::_S_manage;
          local_560._M_ptr = (void *)0x0;
          std::any::_Manager_external<std::__cxx11::string>::_S_create<std::__cxx11::string&>
                    (&local_560,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5b8)
          ;
          uVar1 = (this->_ptr).first;
          local_590 = (_Storage *)CONCAT44(local_590._4_4_,2);
          local_588._M_storage._M_ptr = (void *)0x0;
          if (local_568 == (code *)0x0) {
            local_588._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
          }
          else {
            local_570._M_obj = &local_588;
            (*local_568)(2,&local_568,&local_570);
          }
          uStack_578 = uVar1 + 1;
          (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
          super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
          _M_payload._M_value._type = (TokenType)local_590;
          std::any::any(local_598,&local_588);
          (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
          super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
          _M_payload._M_value._lineNumber = uStack_578;
          (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
          super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
          _M_engaged = true;
          if (local_588._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
            (*local_588._M_manager)(_Op_destroy,&local_588,(_Arg *)0x0);
            local_588._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
          }
          if (local_568 != (code *)0x0) {
            (*local_568)(3,&local_568,0);
            local_568 = (code *)0x0;
          }
        }
        else {
          local_558 = std::any::
                      _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::_S_manage;
          local_550._M_ptr = (void *)0x0;
          std::any::_Manager_external<std::__cxx11::string>::_S_create<std::__cxx11::string&>
                    (&local_550,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5b8)
          ;
          uVar1 = (this->_ptr).first;
          local_590 = (_Storage *)CONCAT44(local_590._4_4_,3);
          local_588._M_storage._M_ptr = (void *)0x0;
          if (local_558 == (code *)0x0) {
            local_588._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
          }
          else {
            local_570._M_obj = &local_588;
            (*local_558)(2,&local_558,&local_570);
          }
          uStack_578 = uVar1 + 1;
          (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
          super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
          _M_payload._M_value._type = (TokenType)local_590;
          std::any::any(local_598,&local_588);
          (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
          super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
          _M_payload._M_value._lineNumber = uStack_578;
          (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
          super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
          _M_engaged = true;
          if (local_588._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
            (*local_588._M_manager)(_Op_destroy,&local_588,(_Arg *)0x0);
            local_588._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
          }
          if (local_558 != (code *)0x0) {
            (*local_558)(3,&local_558,0);
            local_558 = (code *)0x0;
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_5b8._4_4_,local_5b8._0_4_) != &local_5a8) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_5b8._4_4_,local_5b8._0_4_),
                        local_5a8._M_allocated_capacity + 1);
      }
      uVar15 = 6;
      break;
    case 7:
      if ((uVar2 & 1) == 0) {
        std::__throw_bad_optional_access();
      }
      if (_Var16._M_value == '=') {
        local_588._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x2;
        local_588._M_storage._0_3_ = 0x3d3d;
        local_4f8._M_manager =
             std::any::
             _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::_S_manage;
        local_4f8._M_storage._M_ptr = (void *)0x0;
        local_590 = p_Var14;
        local_4f8._M_storage._M_ptr = operator_new(0x20);
        *(long **)local_4f8._M_storage._M_ptr = (long *)((long)local_4f8._M_storage._M_ptr + 0x10);
        ((_Storage *)((long)local_4f8._M_storage._M_ptr + 0x10))->_M_ptr =
             (void *)local_588._M_storage;
        *(uint64_t *)((long)local_4f8._M_storage._M_ptr + 0x18) = uStack_578;
        *(long *)((long)local_4f8._M_storage._M_ptr + 8) = 2;
        local_588._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
        local_588._M_storage._M_ptr = local_588._M_storage._M_ptr & 0xffffffffffffff00;
        uVar1 = (this->_ptr).first;
        local_5b8._0_4_ = EQUAL_SIGN;
        local_5a8._M_allocated_capacity = 0;
        local_590 = p_Var14;
        local_570._M_obj = local_5b8 + 8;
        std::any::
        _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_S_manage(_Op_clone,&local_4f8,&local_570);
        local_5a8._8_8_ = uVar1 + 1;
        (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_payload._M_value._type = local_5b8._0_4_;
        std::any::any(local_598,(any *)(local_5b8 + 8));
        (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_payload._M_value._lineNumber = local_5a8._8_8_;
        (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_engaged = true;
        if ((code *)local_5b8._8_8_ != (code *)0x0) {
          (*(code *)local_5b8._8_8_)(_Op_destroy,(any *)(local_5b8 + 8),(_Arg *)0x0);
          local_5b8._8_8_ = (code *)0x0;
        }
        if (local_4f8._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
          (*local_4f8._M_manager)(_Op_destroy,&local_4f8,(_Arg *)0x0);
          local_4f8._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
        }
        if (local_590 != p_Var14) {
          operator_delete(local_590,(long)local_588._M_storage._M_ptr + 1);
        }
      }
      else {
        pVar18 = previousPos(this);
        this->_ptr = pVar18;
        local_4c8 = std::any::_Manager_internal<char>::_S_manage;
        local_4c0 = 0x3d;
        local_5a8._8_8_ = pVar18.first + 1;
        local_5b8._0_4_ = ASSIGNMENT_SIGN;
        local_5a8._M_allocated_capacity = 0x3d;
        local_5b8._8_8_ = std::any::_Manager_internal<char>::_S_manage;
        (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_payload._M_value._type = ASSIGNMENT_SIGN;
        std::any::any(local_598,(any *)(local_5b8 + 8));
        (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_payload._M_value._lineNumber = local_5a8._8_8_;
        (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_engaged = true;
        if ((code *)local_5b8._8_8_ != (code *)0x0) {
          (*(code *)local_5b8._8_8_)(_Op_destroy,(any *)(local_5b8 + 8),(_Arg *)0x0);
          local_5b8._8_8_ = (code *)0x0;
        }
        if (local_4c8 != (code *)0x0) {
          (*local_4c8)(3,&local_4c8,0);
          local_4c8 = (code *)0x0;
        }
      }
      uVar15 = 7;
      break;
    case 8:
      pVar18 = previousPos(this);
      this->_ptr = pVar18;
      local_468 = std::any::_Manager_internal<char>::_S_manage;
      local_460 = 0x3b;
      local_5a8._8_8_ = pVar18.first + 1;
      local_5b8._0_4_ = SEMICOLON;
      local_5a8._M_allocated_capacity = 0x3b;
      local_5b8._8_8_ = std::any::_Manager_internal<char>::_S_manage;
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_payload._M_value._type = SEMICOLON;
      std::any::any(local_598,(any *)(local_5b8 + 8));
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_payload._M_value._lineNumber = local_5a8._8_8_;
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_engaged = true;
      if ((code *)local_5b8._8_8_ != (code *)0x0) {
        (*(code *)local_5b8._8_8_)(_Op_destroy,(any *)(local_5b8 + 8),(_Arg *)0x0);
        local_5b8._8_8_ = (code *)0x0;
      }
      if (local_468 != (code *)0x0) {
        (*local_468)(3,&local_468,0);
        local_468 = (code *)0x0;
      }
      uVar15 = 8;
      break;
    case 9:
      pVar18 = previousPos(this);
      this->_ptr = pVar18;
      local_478 = std::any::_Manager_internal<char>::_S_manage;
      local_470 = 0x28;
      local_5a8._8_8_ = pVar18.first + 1;
      local_5b8._0_4_ = LEFT_BRACKET;
      local_5a8._M_allocated_capacity = 0x28;
      local_5b8._8_8_ = std::any::_Manager_internal<char>::_S_manage;
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_payload._M_value._type = LEFT_BRACKET;
      std::any::any(local_598,(any *)(local_5b8 + 8));
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_payload._M_value._lineNumber = local_5a8._8_8_;
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_engaged = true;
      if ((code *)local_5b8._8_8_ != (code *)0x0) {
        (*(code *)local_5b8._8_8_)(_Op_destroy,(any *)(local_5b8 + 8),(_Arg *)0x0);
        local_5b8._8_8_ = (code *)0x0;
      }
      if (local_478 != (code *)0x0) {
        (*local_478)(3,&local_478,0);
        local_478 = (code *)0x0;
      }
      uVar15 = 9;
      break;
    case 10:
      pVar18 = previousPos(this);
      this->_ptr = pVar18;
      local_488 = std::any::_Manager_internal<char>::_S_manage;
      local_480 = 0x29;
      local_5a8._8_8_ = pVar18.first + 1;
      local_5b8._0_4_ = RIGHT_BRACKET;
      local_5a8._M_allocated_capacity = 0x29;
      local_5b8._8_8_ = std::any::_Manager_internal<char>::_S_manage;
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_payload._M_value._type = RIGHT_BRACKET;
      std::any::any(local_598,(any *)(local_5b8 + 8));
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_payload._M_value._lineNumber = local_5a8._8_8_;
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_engaged = true;
      if ((code *)local_5b8._8_8_ != (code *)0x0) {
        (*(code *)local_5b8._8_8_)(_Op_destroy,(any *)(local_5b8 + 8),(_Arg *)0x0);
        local_5b8._8_8_ = (code *)0x0;
      }
      if (local_488 != (code *)0x0) {
        (*local_488)(3,&local_488,0);
        local_488 = (code *)0x0;
      }
      uVar15 = 10;
      break;
    case 0xb:
      if ((uVar2 & 1) == 0) {
        std::__throw_bad_optional_access();
      }
      if (_Var16._M_value == '=') {
        local_588._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x2;
        local_588._M_storage._0_3_ = 0x3d3e;
        local_508._M_manager =
             std::any::
             _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::_S_manage;
        local_508._M_storage._M_ptr = (void *)0x0;
        local_590 = p_Var14;
        local_508._M_storage._M_ptr = operator_new(0x20);
        *(long **)local_508._M_storage._M_ptr = (long *)((long)local_508._M_storage._M_ptr + 0x10);
        ((_Storage *)((long)local_508._M_storage._M_ptr + 0x10))->_M_ptr =
             (void *)local_588._M_storage;
        *(uint64_t *)((long)local_508._M_storage._M_ptr + 0x18) = uStack_578;
        *(long *)((long)local_508._M_storage._M_ptr + 8) = 2;
        local_588._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
        local_588._M_storage._M_ptr = local_588._M_storage._M_ptr & 0xffffffffffffff00;
        uVar1 = (this->_ptr).first;
        local_5b8._0_4_ = GREATER_THAN_EQUAL_SIGH;
        local_5a8._M_allocated_capacity = 0;
        local_590 = p_Var14;
        local_570._M_obj = local_5b8 + 8;
        std::any::
        _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_S_manage(_Op_clone,&local_508,&local_570);
        local_5a8._8_8_ = uVar1 + 1;
        (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_payload._M_value._type = local_5b8._0_4_;
        std::any::any(local_598,(any *)(local_5b8 + 8));
        (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_payload._M_value._lineNumber = local_5a8._8_8_;
        (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_engaged = true;
        if ((code *)local_5b8._8_8_ != (code *)0x0) {
          (*(code *)local_5b8._8_8_)(_Op_destroy,(any *)(local_5b8 + 8),(_Arg *)0x0);
          local_5b8._8_8_ = (code *)0x0;
        }
        if (local_508._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
          (*local_508._M_manager)(_Op_destroy,&local_508,(_Arg *)0x0);
          local_508._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
        }
        if (local_590 != p_Var14) {
          operator_delete(local_590,(long)local_588._M_storage._M_ptr + 1);
        }
      }
      else {
        pVar18 = previousPos(this);
        this->_ptr = pVar18;
        local_4d8 = std::any::_Manager_internal<char>::_S_manage;
        local_4d0 = 0x7b;
        local_5a8._8_8_ = pVar18.first + 1;
        local_5b8._0_4_ = GREATER_THAN_SIGH;
        local_5a8._M_allocated_capacity = 0x7b;
        local_5b8._8_8_ = std::any::_Manager_internal<char>::_S_manage;
        (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_payload._M_value._type = GREATER_THAN_SIGH;
        std::any::any(local_598,(any *)(local_5b8 + 8));
        (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_payload._M_value._lineNumber = local_5a8._8_8_;
        (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_engaged = true;
        if ((code *)local_5b8._8_8_ != (code *)0x0) {
          (*(code *)local_5b8._8_8_)(_Op_destroy,(any *)(local_5b8 + 8),(_Arg *)0x0);
          local_5b8._8_8_ = (code *)0x0;
        }
        if (local_4d8 != (code *)0x0) {
          (*local_4d8)(3,&local_4d8,0);
          local_4d8 = (code *)0x0;
        }
      }
      uVar15 = 0xb;
      break;
    case 0xc:
      if ((uVar2 & 1) == 0) {
        std::__throw_bad_optional_access();
      }
      if (_Var16._M_value == '=') {
        local_588._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x2;
        local_588._M_storage._0_3_ = 0x3d3c;
        local_518._M_manager =
             std::any::
             _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::_S_manage;
        local_518._M_storage._M_ptr = (void *)0x0;
        local_590 = p_Var14;
        local_518._M_storage._M_ptr = operator_new(0x20);
        *(long **)local_518._M_storage._M_ptr = (long *)((long)local_518._M_storage._M_ptr + 0x10);
        ((_Storage *)((long)local_518._M_storage._M_ptr + 0x10))->_M_ptr =
             (void *)local_588._M_storage;
        *(uint64_t *)((long)local_518._M_storage._M_ptr + 0x18) = uStack_578;
        *(long *)((long)local_518._M_storage._M_ptr + 8) = 2;
        local_588._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
        local_588._M_storage._M_ptr = local_588._M_storage._M_ptr & 0xffffffffffffff00;
        uVar1 = (this->_ptr).first;
        local_5b8._0_4_ = LESS_THAN_EQUAL_SIGH;
        local_5a8._M_allocated_capacity = 0;
        local_590 = p_Var14;
        local_570._M_obj = local_5b8 + 8;
        std::any::
        _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_S_manage(_Op_clone,&local_518,&local_570);
        local_5a8._8_8_ = uVar1 + 1;
        (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_payload._M_value._type = local_5b8._0_4_;
        std::any::any(local_598,(any *)(local_5b8 + 8));
        (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_payload._M_value._lineNumber = local_5a8._8_8_;
        (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_engaged = true;
        if ((code *)local_5b8._8_8_ != (code *)0x0) {
          (*(code *)local_5b8._8_8_)(_Op_destroy,(any *)(local_5b8 + 8),(_Arg *)0x0);
          local_5b8._8_8_ = (code *)0x0;
        }
        if (local_518._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
          (*local_518._M_manager)(_Op_destroy,&local_518,(_Arg *)0x0);
          local_518._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
        }
        if (local_590 != p_Var14) {
          operator_delete(local_590,(long)local_588._M_storage._M_ptr + 1);
        }
      }
      else {
        pVar18 = previousPos(this);
        this->_ptr = pVar18;
        local_4e8 = std::any::_Manager_internal<char>::_S_manage;
        local_4e0 = 0x3c;
        local_5a8._8_8_ = pVar18.first + 1;
        local_5b8._0_4_ = LESS_THAN_SIGH;
        local_5a8._M_allocated_capacity = 0x3c;
        local_5b8._8_8_ = std::any::_Manager_internal<char>::_S_manage;
        (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_payload._M_value._type = LESS_THAN_SIGH;
        std::any::any(local_598,(any *)(local_5b8 + 8));
        (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_payload._M_value._lineNumber = local_5a8._8_8_;
        (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_engaged = true;
        if ((code *)local_5b8._8_8_ != (code *)0x0) {
          (*(code *)local_5b8._8_8_)(_Op_destroy,(any *)(local_5b8 + 8),(_Arg *)0x0);
          local_5b8._8_8_ = (code *)0x0;
        }
        if (local_4e8 != (code *)0x0) {
          (*local_4e8)(3,&local_4e8,0);
          local_4e8 = (code *)0x0;
        }
      }
      uVar15 = 0xc;
      break;
    case 0xd:
      pVar18 = previousPos(this);
      this->_ptr = pVar18;
      local_4a8 = std::any::_Manager_internal<char>::_S_manage;
      local_4a0 = 0x7b;
      local_5a8._8_8_ = pVar18.first + 1;
      local_5b8._0_4_ = LEFT_BRACE;
      local_5a8._M_allocated_capacity = 0x7b;
      local_5b8._8_8_ = std::any::_Manager_internal<char>::_S_manage;
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_payload._M_value._type = LEFT_BRACE;
      std::any::any(local_598,(any *)(local_5b8 + 8));
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_payload._M_value._lineNumber = local_5a8._8_8_;
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_engaged = true;
      if ((code *)local_5b8._8_8_ != (code *)0x0) {
        (*(code *)local_5b8._8_8_)(_Op_destroy,(any *)(local_5b8 + 8),(_Arg *)0x0);
        local_5b8._8_8_ = (code *)0x0;
      }
      if (local_4a8 != (code *)0x0) {
        (*local_4a8)(3,&local_4a8,0);
        local_4a8 = (code *)0x0;
      }
      uVar15 = 0xd;
      break;
    case 0xe:
      pVar18 = previousPos(this);
      this->_ptr = pVar18;
      local_4b8 = std::any::_Manager_internal<char>::_S_manage;
      local_4b0 = 0x7d;
      local_5a8._8_8_ = pVar18.first + 1;
      local_5b8._0_4_ = RIGHT_BRACE;
      local_5a8._M_allocated_capacity = 0x7d;
      local_5b8._8_8_ = std::any::_Manager_internal<char>::_S_manage;
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_payload._M_value._type = RIGHT_BRACE;
      std::any::any(local_598,(any *)(local_5b8 + 8));
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_payload._M_value._lineNumber = local_5a8._8_8_;
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_engaged = true;
      if ((code *)local_5b8._8_8_ != (code *)0x0) {
        (*(code *)local_5b8._8_8_)(_Op_destroy,(any *)(local_5b8 + 8),(_Arg *)0x0);
        local_5b8._8_8_ = (code *)0x0;
      }
      if (local_4b8 != (code *)0x0) {
        (*local_4b8)(3,&local_4b8,0);
        local_4b8 = (code *)0x0;
      }
      uVar15 = 0xe;
      break;
    case 0xf:
      if ((uVar2 & 1) == 0) {
        std::__throw_bad_optional_access();
      }
      if (_Var16._M_value != '=') {
        psVar12 = (string *)__cxa_allocate_exception(0x28);
        local_218 = &local_208;
        local_208 = 0x64696c61766e49;
        uStack_201 = 0x49;
        uStack_200 = 0x7272457475706e;
        local_210 = 0xf;
        local_1f9 = 0;
        uVar1 = (this->_ptr).first;
        *(string **)psVar12 = psVar12 + 0x10;
        std::__cxx11::string::_M_construct<char*>(psVar12,local_218,&local_1f9);
        *(unsigned_long *)(psVar12 + 0x20) = uVar1 + 1;
        __cxa_throw(psVar12,&Error::typeinfo,Error::~Error);
      }
      local_588._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x2;
      local_588._M_storage._0_3_ = 0x3d21;
      local_528._M_manager =
           std::any::
           _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::_S_manage;
      local_528._M_storage._M_ptr = (void *)0x0;
      local_590 = p_Var14;
      local_528._M_storage._M_ptr = operator_new(0x20);
      *(long **)local_528._M_storage._M_ptr = (long *)((long)local_528._M_storage._M_ptr + 0x10);
      ((_Storage *)((long)local_528._M_storage._M_ptr + 0x10))->_M_ptr =
           (void *)local_588._M_storage;
      *(uint64_t *)((long)local_528._M_storage._M_ptr + 0x18) = uStack_578;
      *(long *)((long)local_528._M_storage._M_ptr + 8) = 2;
      local_588._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
      local_588._M_storage._M_ptr = local_588._M_storage._M_ptr & 0xffffffffffffff00;
      uVar1 = (this->_ptr).first;
      local_5b8._0_4_ = UNEQUAL_SIGN;
      local_5a8._M_allocated_capacity = 0;
      local_590 = p_Var14;
      local_570._M_obj = local_5b8 + 8;
      std::any::
      _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_S_manage(_Op_clone,&local_528,&local_570);
      local_5a8._8_8_ = uVar1 + 1;
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_payload._M_value._type = local_5b8._0_4_;
      std::any::any(local_598,(any *)(local_5b8 + 8));
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_payload._M_value._lineNumber = local_5a8._8_8_;
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_engaged = true;
      if ((code *)local_5b8._8_8_ != (code *)0x0) {
        (*(code *)local_5b8._8_8_)(_Op_destroy,(any *)(local_5b8 + 8),(_Arg *)0x0);
        local_5b8._8_8_ = (code *)0x0;
      }
      if (local_528._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
        (*local_528._M_manager)(_Op_destroy,&local_528,(_Arg *)0x0);
        local_528._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
      }
      if (local_590 != p_Var14) {
        operator_delete(local_590,(long)local_588._M_storage._M_ptr + 1);
      }
      uVar15 = 0xf;
      break;
    case 0x10:
      pVar18 = previousPos(this);
      this->_ptr = pVar18;
      local_498 = std::any::_Manager_internal<char>::_S_manage;
      local_490 = 0x2c;
      local_5a8._8_8_ = pVar18.first + 1;
      local_5b8._0_4_ = COMMA_SIGH;
      local_5a8._M_allocated_capacity = 0x2c;
      local_5b8._8_8_ = std::any::_Manager_internal<char>::_S_manage;
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_payload._M_value._type = COMMA_SIGH;
      std::any::any(local_598,(any *)(local_5b8 + 8));
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_payload._M_value._lineNumber = local_5a8._8_8_;
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_engaged = true;
      if ((code *)local_5b8._8_8_ != (code *)0x0) {
        (*(code *)local_5b8._8_8_)(_Op_destroy,(any *)(local_5b8 + 8),(_Arg *)0x0);
        local_5b8._8_8_ = (code *)0x0;
      }
      if (local_498 != (code *)0x0) {
        (*local_498)(3,&local_498,0);
        local_498 = (code *)0x0;
      }
      uVar15 = 0x10;
      break;
    case 0x11:
      if ((uVar2 & 1) == 0) {
        std::__cxx11::stringbuf::str();
        uVar7 = htoi(local_3b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8[0]._M_dataplus._M_p != &local_3b8[0].field_2) {
          operator_delete(local_3b8[0]._M_dataplus._M_p,
                          local_3b8[0].field_2._M_allocated_capacity + 1);
        }
        local_408 = std::any::_Manager_internal<int>::_S_manage;
        local_400 = (ulong)uVar7;
        local_5a8._8_8_ = (this->_ptr).first + 1;
        local_5b8._0_4_ = UNSIGNED_INTEGER;
        local_5a8._M_allocated_capacity._4_4_ = 0;
        local_5a8._M_allocated_capacity._0_4_ = uVar7;
        local_5b8._8_8_ = std::any::_Manager_internal<int>::_S_manage;
        (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_payload._M_value._type = UNSIGNED_INTEGER;
        std::any::any(local_598,(any *)(local_5b8 + 8));
        (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_payload._M_value._lineNumber = local_5a8._8_8_;
        (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_engaged = true;
        if ((code *)local_5b8._8_8_ != (code *)0x0) {
          (*(code *)local_5b8._8_8_)(_Op_destroy,(any *)(local_5b8 + 8),(_Arg *)0x0);
          local_5b8._8_8_ = (code *)0x0;
        }
        if (local_408 != (code *)0x0) {
          (*local_408)(3,&local_408,0);
          local_408 = (code *)0x0;
        }
        uVar15 = 0x11;
        break;
      }
      bVar17 = true;
      if ((5 < (byte)(_Var16._M_value + 0x9fU)) && (9 < (uVar8 & 0xfe) - 0x30)) {
        bVar17 = (byte)(_Var16._M_value + 0xbfU) < 0x26;
      }
      if (bVar17) {
        local_5b8[0] = _Var16._M_value;
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_5b8,1);
      }
      else {
        pVar18 = previousPos(this);
        this->_ptr = pVar18;
        std::__cxx11::stringbuf::str();
        uVar7 = htoi(&local_3d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
          operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
        }
        local_418 = std::any::_Manager_internal<int>::_S_manage;
        local_410 = (ulong)uVar7;
        local_5a8._8_8_ = (this->_ptr).first + 1;
        local_5b8._0_4_ = UNSIGNED_INTEGER;
        local_5a8._M_allocated_capacity._4_4_ = 0;
        local_5a8._M_allocated_capacity._0_4_ = uVar7;
        local_5b8._8_8_ = std::any::_Manager_internal<int>::_S_manage;
        (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_payload._M_value._type = UNSIGNED_INTEGER;
        std::any::any(local_598,(any *)(local_5b8 + 8));
        (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_payload._M_value._lineNumber = local_5a8._8_8_;
        (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_engaged = true;
        if ((code *)local_5b8._8_8_ != (code *)0x0) {
          (*(code *)local_5b8._8_8_)(_Op_destroy,(any *)(local_5b8 + 8),(_Arg *)0x0);
          local_5b8._8_8_ = (code *)0x0;
        }
        if (local_418 != (code *)0x0) {
          (*local_418)(3,&local_418,0);
          local_418 = (code *)0x0;
        }
      }
      uVar15 = 0x11;
      if (bVar17) goto LAB_0010ed23;
      bVar17 = false;
      goto LAB_0010eca6;
    }
    bVar17 = false;
LAB_0010eca6:
    if (!bVar17) {
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_138);
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::optional<Token> Tokenizer::nextToken() {
	std::stringstream ss;
	DFAState current_state = DFAState::INITIAL_STATE;
	while (true) {
		auto current_char = nextChar();
		switch (current_state)
		{
		case DFAState::INITIAL_STATE: {
			//�����ļ�β
			if (!current_char.has_value()) {
				return {};
			}

			auto ch = current_char.value();
			// �����Ƿ������˲��Ϸ����ַ�����ʼ��Ϊ��
			auto invalid = false;

			if (miniplc0::isspace(ch)) // �������ַ��ǿհ��ַ����ո񡢻��С��Ʊ����ȣ�
				current_state = DFAState::INITIAL_STATE;
			else if (!miniplc0::isprint(ch)) // control codes and backspace
				invalid = true;
			else if (miniplc0::isdigit(ch))
				current_state = DFAState::UNSIGNED_INTEGER_STATE;
			else if (miniplc0::isalpha(ch))
				current_state = DFAState::IDENTIFIER_STATE;
			else {
				switch (ch) {
				case '=':
					current_state = DFAState::EQUAL_SIGN_STATE;
					break;
				case '-':
					current_state = DFAState::MINUS_SIGN_STATE;
					break;
				case '+':
					current_state = DFAState::PLUS_SIGN_STATE;
					break;
				case '*':
					current_state = DFAState::MULTIPLICATION_SIGN_STATE;
					break;
				case '/':
					current_state = DFAState::DIVISION_SIGN_STATE;
					break;
				case ';':
					current_state = DFAState::SEMICOLON_STATE;
					break;
				case '(':
					current_state = DFAState::LEFTBRACKET_STATE;
					break;
				case ')':
					current_state = DFAState::RIGHTBRACKET_STATE;
					break;

					//��min0�Ļ�����������6��״̬
				case '>':
					current_state = DFAState::GREATER_THAN_STATE;
					break;
				case '<':
					current_state = DFAState::LESS_THAN_STATE;
					break;
				case '{':
					current_state = DFAState::LEFTBRACE_STATE;
					break;
				case '}':
					current_state = DFAState::RIGHTBRACE_STATE;
					break;
				case '!':
					current_state = DFAState::EXCLAMATION_SIGH_STATE;
					break;
				case ',':
					current_state = DFAState::COMMA_STATE;
					break;

					// �����ܵ��ַ����µĲ��Ϸ���״̬
				default:
					invalid = true;
					break;
				}
			}
			if (invalid) {
				unreadLast();
				throw Error("InvalidInputErr", _ptr.first + 1);
			}
			// �����������ַ�������״̬��ת�ƣ�˵������һ��token�ĵ�һ���ַ�
			if (current_state != DFAState::INITIAL_STATE) // ignore white spaces
				ss << ch; // �洢�������ַ�
			break;
		}
		case DFAState::UNSIGNED_INTEGER_STATE: {
			// ������ǰ�Ѿ��������ļ�β���������Ѿ��������ַ���Ϊ����
			//     �����ɹ��򷵻��޷����������͵�token�����򷵻ر�������
			// �����������ַ������֣����洢�������ַ�
			// ��������������ĸ�������Ƿ�Ϊx�Լ�����λ�÷���ʮ����������תΪʮ��������״̬��������������
			// �����������ַ�������������֮һ�������˶������ַ����������Ѿ��������ַ���Ϊ����
			//     �����ɹ��򷵻��޷����������͵�token�����򷵻ر�������
			if (!current_char.has_value()) {
				if (ss.str()[0] == '0' && ss.str().size() > 1) {
					throw Error("StartWithZeroErr", _ptr.first + 1);
				}
				try {
					int ret = std::stoi(ss.str());
					return Token(TokenType::UNSIGNED_INTEGER, ret, _ptr.first + 1);
				}
				catch (std::invalid_argument) {
					throw Error("InvalidAgumentErr", _ptr.first + 1);
				}
				catch (std::out_of_range) {
					throw Error("IntegerOverflowErr", _ptr.first + 1);
				}
			}
			auto ch = current_char.value();
			if (miniplc0::isdigit(ch)) {
				ss << ch;
			}
			else if (miniplc0::isalpha(ch)) {
				ss << ch;
				if (ss.str().size() == 2 && (ch == 'x' || ch == 'X')) {
					current_state = DFAState::HEXADECIMAL_STATE;
				}
				else {
					throw Error("InvalidInputErr", _ptr.first + 1);
				}
			}
			else {
				unreadLast();
				if (ss.str()[0] == '0' && ss.str().size() > 1) {
					throw Error("StartWithZeroErr", _ptr.first + 1);
				}
				try {
					int ret = std::stoi(ss.str());
					return Token(TokenType::UNSIGNED_INTEGER, ret, _ptr.first + 1);
				}
				catch (std::invalid_argument) {
					throw Error("InvalidAgumentErr", _ptr.first + 1);
				}
				catch (std::out_of_range) {
					throw Error("IntegerOverflowErr", _ptr.first + 1);
				}
			}
			break;
		}
		case DFAState::HEXADECIMAL_STATE: {
			if (!current_char.has_value()) {
				try {
					int ret = htoi(ss.str());
					return Token(TokenType::UNSIGNED_INTEGER, ret, _ptr.first + 1);
				}
				catch (std::invalid_argument) {
					throw Error("InvalidAgumentErr", _ptr.first + 1);
				}
				catch (std::out_of_range) {
					throw Error("IntegerOverflowErr", _ptr.first + 1);
				}
			}
			auto ch = current_char.value();
			if (miniplc0::ishexadecimal(ch)) {
				ss << ch;
			}
			else {
				unreadLast();
				try {
					int ret = htoi(ss.str());
					return Token(TokenType::UNSIGNED_INTEGER, ret, _ptr.first + 1);
				}
				catch (std::invalid_argument) {
					throw Error("InvalidAgumentErr", _ptr.first + 1);
				}
				catch (std::out_of_range) {
					throw Error("IntegerOverflowErr", _ptr.first + 1);
				}
			}
			break;
		}
		case DFAState::IDENTIFIER_STATE: {
			// ������ǰ�Ѿ��������ļ�β���������Ѿ��������ַ���
			//     �������������ǹؼ��֣���ô���ض�Ӧ�ؼ��ֵ�token�����򷵻ر�ʶ����token
			// �������������ַ�����ĸ�����洢�������ַ�
			// �����������ַ�������������֮һ�������˶������ַ����������Ѿ��������ַ���
			//     �������������ǹؼ��֣���ô���ض�Ӧ�ؼ��ֵ�token�����򷵻ر�ʶ����token

			if (!current_char.has_value()) {
				std::string str = ss.str();
				if (ReservedWords.find(str) != ReservedWords.end()) {
					return Token(TokenType::RESERVED_WORD, str, _ptr.first + 1);
				}
				else {
					return Token(TokenType::IDENTIFIER, str, _ptr.first + 1);
				}
			}
			auto ch = current_char.value();
			if (miniplc0::isalpha(ch) || miniplc0::isdigit(ch)) {
				ss << ch;
			}
			else {
				unreadLast();
				std::string str = ss.str();
				if (ReservedWords.find(str) != ReservedWords.end()) {
					return Token(TokenType::RESERVED_WORD, str, _ptr.first + 1);
				}
				else {
					return Token(TokenType::IDENTIFIER, str, _ptr.first + 1);
				}
			}
			break;
		}
		case DFAState::PLUS_SIGN_STATE: {
			unreadLast(); // Yes, we unread last char even if it's an EOF.
			return Token(TokenType::PLUS_SIGN, '+', _ptr.first + 1);
		}
		case DFAState::MINUS_SIGN_STATE: {
			unreadLast();
			return Token(TokenType::MINUS_SIGN, '-', _ptr.first + 1);
		}
		case DFAState::MULTIPLICATION_SIGN_STATE: {
			unreadLast();
			return Token(TokenType::MULTIPLICATION_SIGN, '*', _ptr.first + 1);
		}
		case DFAState::DIVISION_SIGN_STATE: {
			unreadLast();
			return Token(TokenType::DIVISION_SIGN, '/', _ptr.first + 1);
		}
		case DFAState::SEMICOLON_STATE: {
			unreadLast();
			return Token(TokenType::SEMICOLON, ';', _ptr.first + 1);
		}
		case DFAState::LEFTBRACKET_STATE: {
			unreadLast();
			return Token(TokenType::LEFT_BRACKET, '(', _ptr.first + 1);
		}
		case DFAState::RIGHTBRACKET_STATE: {
			unreadLast();
			return Token(TokenType::RIGHT_BRACKET, ')', _ptr.first + 1);
		}

										 //c0�ķ�
		case DFAState::COMMA_STATE: {
			unreadLast();
			return Token(TokenType::COMMA_SIGH, ',', _ptr.first + 1);
		}
		case DFAState::LEFTBRACE_STATE: {
			unreadLast();
			return Token(TokenType::LEFT_BRACE, '{', _ptr.first + 1);
		}
		case DFAState::RIGHTBRACE_STATE: {
			unreadLast();
			return Token(TokenType::RIGHT_BRACE, '}', _ptr.first + 1);
		}
		case DFAState::EQUAL_SIGN_STATE: {
			//= & ==
			auto ch = current_char.value();
			if (ch == '=') {
				return Token(TokenType::EQUAL_SIGN, std::string("=="), _ptr.first + 1);
			}
			else {
				unreadLast();
				return Token(TokenType::ASSIGNMENT_SIGN, '=', _ptr.first + 1);
			}
		}
		case DFAState::GREATER_THAN_STATE: {
			//> & >=
			auto ch = current_char.value();
			if (ch == '=') {
				return Token(TokenType::GREATER_THAN_EQUAL_SIGH, std::string(">="), _ptr.first + 1);
			}
			else {
				unreadLast();
				return Token(TokenType::GREATER_THAN_SIGH, '{', _ptr.first + 1);
			}
		}
		case DFAState::LESS_THAN_STATE: {
			//< & <=
			auto ch = current_char.value();
			if (ch == '=') {
				return Token(TokenType::LESS_THAN_EQUAL_SIGH, std::string("<="), _ptr.first + 1);
			}
			else {
				unreadLast();
				return Token(TokenType::LESS_THAN_SIGH, '<', _ptr.first + 1);
			}
		}
		case DFAState::EXCLAMATION_SIGH_STATE: {
			//!=
			auto ch = current_char.value();
			if (ch == '=') {
				return Token(TokenType::UNEQUAL_SIGN, std::string("!="), _ptr.first + 1);
			}
			else {
				throw Error("InvalidInputErr", _ptr.first + 1);
			}
		}
		default:
			break;
		}
	}
}